

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall SMBusSimulationDataGenerator::OutputStart(SMBusSimulationDataGenerator *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = SimulationChannelDescriptor::GetCurrentBitState();
  iVar1 = (int)this;
  if (iVar2 == 0) {
    ClockGenerator::AdvanceByTimeS(4.9999999999999996e-06);
    SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
    SimulationChannelDescriptor::Transition();
  }
  iVar2 = SimulationChannelDescriptor::GetCurrentBitState();
  if (iVar2 == 0) {
    ClockGenerator::AdvanceByTimeS(4.7e-06);
    SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
    SimulationChannelDescriptor::Transition();
  }
  uVar3 = iVar1 + 0x18;
  ClockGenerator::AdvanceByTimeS(9.999999999999999e-06);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar3);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(9.999999999999999e-06);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar3);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(9.4e-06);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar3);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputStart()
{
    // get SMBDAT high
    if( mSMBDAT->GetCurrentBitState() == BIT_LOW )
    {
        AdvanceAllBySec( ONE_US * 5 );
        mSMBDAT->Transition();
    }

    // get SMBCLK high
    if( mSMBCLK->GetCurrentBitState() == BIT_LOW )
    {
        AdvanceAllBySec( TSU_STA_MIN );
        mSMBCLK->Transition();
    }

    // SMBDAT goes low
    AdvanceAllBySec( ONE_US * 10 );
    mSMBDAT->Transition();

    // SMBCLK goes low
    AdvanceAllBySec( ONE_US * 10 );
    mSMBCLK->Transition();

    // pause a little
    AdvanceAllBySec( TBUF_MIN * 2 );
}